

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validation.cpp
# Opt level: O0

void __thiscall
anon_unknown.dwarf_a31d20::MemPoolAccept::ATMPArgs::ATMPArgs
          (ATMPArgs *this,CChainParams *chainparams,int64_t accept_time,bool bypass_limits,
          vector<COutPoint,_std::allocator<COutPoint>_> *coins_to_uncache,bool test_accept,
          bool allow_replacement,bool allow_sibling_eviction,bool package_submission,
          bool package_feerates,optional<CFeeRate> client_maxfeerate,bool allow_carveouts)

{
  long lVar1;
  byte bVar2;
  byte in_CL;
  byte bVar3;
  bool *in_RDX;
  byte bVar4;
  undefined8 in_RSI;
  byte bVar5;
  char *in_RDI;
  byte bVar6;
  undefined8 in_R8;
  byte in_R9B;
  byte bVar7;
  byte bVar8;
  long in_FS_OFFSET;
  byte in_stack_00000008;
  byte in_stack_00000018;
  byte in_stack_00000038;
  undefined2 in_stack_ffffffffffffffa0;
  undefined7 in_stack_ffffffffffffffb0;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  bVar8 = in_CL & 1;
  bVar7 = in_R9B & 1;
  bVar6 = in_stack_00000008 & 1;
  bVar5 = (byte)coins_to_uncache & 1;
  bVar4 = in_stack_00000018 & 1;
  bVar3 = (byte)accept_time & 1;
  bVar2 = in_stack_00000038 & 1;
  *(undefined8 *)in_RDI = in_RSI;
  *(bool **)(in_RDI + 8) = in_RDX;
  in_RDI[0x10] = bVar8;
  *(undefined8 *)(in_RDI + 0x18) = in_R8;
  in_RDI[0x20] = bVar7;
  in_RDI[0x21] = bVar6;
  in_RDI[0x22] = bVar5;
  in_RDI[0x23] = bVar4;
  in_RDI[0x24] = bVar3;
  *(CChainParams **)(in_RDI + 0x28) = chainparams;
  *(ATMPArgs **)(in_RDI + 0x30) = this;
  in_RDI[0x38] = bVar2;
  if ((in_RDI[0x24] & 1U) != 0) {
    inline_assertion_check<false,bool_const&>
              (in_RDX,(char *)(CONCAT17(in_CL,in_stack_ffffffffffffffb0) & 0x1ffffffffffffff),
               (int)((ulong)in_R8 >> 0x20),
               (char *)(CONCAT17(in_R9B,CONCAT16(in_stack_00000008,
                                                 CONCAT15((byte)coins_to_uncache,
                                                          CONCAT14(in_stack_00000018,
                                                                   CONCAT13((byte)accept_time,
                                                                            CONCAT12(
                                                  in_stack_00000038,in_stack_ffffffffffffffa0))))))
                       & 0x10101010101ffff),in_RDI);
    inline_assertion_check<false,bool>
              (in_RDX,(char *)CONCAT17(bVar8,in_stack_ffffffffffffffb0),(int)((ulong)in_R8 >> 0x20),
               (char *)CONCAT17(bVar7,CONCAT16(bVar6,CONCAT15(bVar5,CONCAT14(bVar4,CONCAT13(bVar3,
                                                  CONCAT12(bVar2,in_stack_ffffffffffffffa0)))))),
               in_RDI);
    inline_assertion_check<false,bool>
              (in_RDX,(char *)CONCAT17(bVar8,in_stack_ffffffffffffffb0),(int)((ulong)in_R8 >> 0x20),
               (char *)CONCAT17(bVar7,CONCAT16(bVar6,CONCAT15(bVar5,CONCAT14(bVar4,CONCAT13(bVar3,
                                                  CONCAT12(bVar2,in_stack_ffffffffffffffa0)))))),
               in_RDI);
  }
  if ((in_RDI[0x22] & 1U) != 0) {
    inline_assertion_check<false,bool_const&>
              (in_RDX,(char *)CONCAT17(bVar8,in_stack_ffffffffffffffb0),(int)((ulong)in_R8 >> 0x20),
               (char *)CONCAT17(bVar7,CONCAT16(bVar6,CONCAT15(bVar5,CONCAT14(bVar4,CONCAT13(bVar3,
                                                  CONCAT12(bVar2,in_stack_ffffffffffffffa0)))))),
               in_RDI);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

ATMPArgs(const CChainParams& chainparams,
                 int64_t accept_time,
                 bool bypass_limits,
                 std::vector<COutPoint>& coins_to_uncache,
                 bool test_accept,
                 bool allow_replacement,
                 bool allow_sibling_eviction,
                 bool package_submission,
                 bool package_feerates,
                 std::optional<CFeeRate> client_maxfeerate,
                 bool allow_carveouts)
            : m_chainparams{chainparams},
              m_accept_time{accept_time},
              m_bypass_limits{bypass_limits},
              m_coins_to_uncache{coins_to_uncache},
              m_test_accept{test_accept},
              m_allow_replacement{allow_replacement},
              m_allow_sibling_eviction{allow_sibling_eviction},
              m_package_submission{package_submission},
              m_package_feerates{package_feerates},
              m_client_maxfeerate{client_maxfeerate},
              m_allow_carveouts{allow_carveouts}
        {
            // If we are using package feerates, we must be doing package submission.
            // It also means carveouts and sibling eviction are not permitted.
            if (m_package_feerates) {
                Assume(m_package_submission);
                Assume(!m_allow_carveouts);
                Assume(!m_allow_sibling_eviction);
            }
            if (m_allow_sibling_eviction) Assume(m_allow_replacement);
        }